

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Guild.cpp
# Opt level: O0

void Handlers::Guild_Create(Character *character,PacketReader *reader)

{
  World *pWVar1;
  GuildManager *pGVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint num;
  ulong uVar7;
  mapped_type *pmVar8;
  size_type sVar9;
  long lVar10;
  long lVar11;
  element_type *peVar12;
  element_type *peVar13;
  byte local_215;
  undefined1 local_210 [8];
  PacketBuilder reply;
  string rank_str;
  key_type local_1b8;
  string local_198 [32];
  undefined1 local_178 [16];
  undefined1 local_168 [8];
  shared_ptr<Guild> guild;
  key_type local_150;
  string local_130 [32];
  undefined1 local_110 [8];
  shared_ptr<Guild_Create> create;
  key_type local_f8;
  undefined4 local_d8;
  byte local_d1;
  string local_d0;
  byte local_ab;
  byte local_aa;
  allocator local_a9;
  key_type local_a8;
  undefined1 local_88 [8];
  string description;
  undefined1 local_58 [8];
  string name;
  string tag;
  PacketReader *reader_local;
  Character *character_local;
  
  PacketReader::GetInt(reader);
  PacketReader::GetByte(reader);
  PacketReader::GetBreakString_abi_cxx11_
            ((string *)
             &name.super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
              super__Hash_node_code_cache<true>,reader,0xff);
  PacketReader::GetBreakString_abi_cxx11_((string *)local_58,reader,0xff);
  PacketReader::GetBreakString_abi_cxx11_((string *)local_88,reader,0xff);
  uVar7 = std::__cxx11::string::length();
  local_aa = 0;
  local_ab = 0;
  local_d1 = 0;
  local_215 = 1;
  if (uVar7 < 4) {
    uVar7 = std::__cxx11::string::length();
    pWVar1 = character->world;
    std::allocator<char>::allocator();
    local_aa = 1;
    std::__cxx11::string::string((string *)&local_a8,"GuildMaxNameLength",&local_a9);
    local_ab = 1;
    pmVar8 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](&(pWVar1->config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ,&local_a8);
    iVar5 = util::variant::operator_cast_to_int(pmVar8);
    local_215 = 1;
    if (uVar7 <= (ulong)(long)iVar5) {
      pGVar2 = character->world->guildmanager;
      std::__cxx11::string::string((string *)&local_d0,(string *)local_88);
      local_d1 = 1;
      bVar3 = GuildManager::ValidDescription(pGVar2,&local_d0);
      local_215 = bVar3 ^ 0xff;
    }
  }
  if ((local_d1 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_d0);
  }
  if ((local_ab & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a8);
  }
  if ((local_aa & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  }
  if ((local_215 & 1) == 0) {
    if (character->npc_type == Guild) {
      bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&character->guild);
      create.super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ =
           0;
      create.super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_ =
           0;
      bVar3 = false;
      if (!bVar4) {
        iVar5 = Character::HasItem(character,1,false);
        pWVar1 = character->world;
        std::allocator<char>::allocator();
        create.super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_
             = 1;
        std::__cxx11::string::string
                  ((string *)&local_f8,"GuildPrice",
                   (allocator *)
                   ((long)&create.super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7));
        create.super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_
             = 1;
        pmVar8 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                 ::operator[](&(pWVar1->config).
                               super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                              ,&local_f8);
        iVar6 = util::variant::operator_cast_to_int(pmVar8);
        bVar3 = iVar6 <= iVar5;
      }
      if ((create.super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
           _5_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_f8);
      }
      if ((create.super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
           _6_1_ & 1) != 0) {
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&create.super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7));
      }
      if (bVar3) {
        pGVar2 = character->world->guildmanager;
        std::__cxx11::string::string
                  (local_130,
                   (string *)
                   &name.super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
                    super__Hash_node_code_cache<true>);
        GuildManager::GetCreate((GuildManager *)local_110,(string *)pGVar2);
        std::__cxx11::string::~string(local_130);
        bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_110);
        guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 0;
        guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_ = 0;
        bVar3 = false;
        if (bVar4) {
          peVar12 = std::__shared_ptr_access<Guild_Create,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<Guild_Create,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_110);
          bVar3 = false;
          if (peVar12->leader == character) {
            peVar12 = std::
                      __shared_ptr_access<Guild_Create,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<Guild_Create,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_110);
            sVar9 = std::
                    vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                    ::size(&peVar12->members);
            pWVar1 = character->world;
            std::allocator<char>::allocator();
            guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 1;
            std::__cxx11::string::string
                      ((string *)&local_150,"GuildCreateMembers",
                       (allocator *)
                       ((long)&guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi + 7));
            guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_ = 1;
            pmVar8 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                     ::operator[](&(pWVar1->config).
                                   super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                  ,&local_150);
            iVar5 = util::variant::operator_cast_to_int(pmVar8);
            bVar3 = (ulong)(long)iVar5 <= sVar9;
          }
        }
        if ((guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_ & 1
            ) != 0) {
          std::__cxx11::string::~string((string *)&local_150);
        }
        if ((guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ & 1
            ) != 0) {
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi + 7));
        }
        if (bVar3) {
          pGVar2 = character->world->guildmanager;
          std::shared_ptr<Guild_Create>::shared_ptr
                    ((shared_ptr<Guild_Create> *)local_178,(shared_ptr<Guild_Create> *)local_110);
          std::__cxx11::string::string(local_198,(string *)local_88);
          GuildManager::CreateGuild
                    ((GuildManager *)local_168,(shared_ptr<Guild_Create> *)pGVar2,
                     (string *)local_178);
          std::__cxx11::string::~string(local_198);
          std::shared_ptr<Guild_Create>::~shared_ptr((shared_ptr<Guild_Create> *)local_178);
          pWVar1 = character->world;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_1b8,"GuildPrice",
                     (allocator *)
                     ((long)&rank_str.
                             super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
                             super__Hash_node_code_cache<true>._M_hash_code + 7));
          pmVar8 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                   ::operator[](&(pWVar1->config).
                                 super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                ,&local_1b8);
          iVar5 = util::variant::operator_cast_to_int(pmVar8);
          Character::DelItem(character,1,iVar5);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&rank_str.
                             super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
                             super__Hash_node_code_cache<true>._M_hash_code + 7));
          Character::GuildRankString_abi_cxx11_((string *)&reply.add_size,character);
          std::__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     local_168);
          lVar10 = std::__cxx11::string::length();
          lVar11 = std::__cxx11::string::length();
          PacketBuilder::PacketBuilder
                    ((PacketBuilder *)local_210,PACKET_GUILD,PACKET_CREATE,lVar10 + 0xd + lVar11);
          peVar12 = std::__shared_ptr_access<Guild_Create,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<Guild_Create,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_110);
          iVar5 = Character::PlayerID(peVar12->leader);
          PacketBuilder::AddShort((PacketBuilder *)local_210,(unsigned_short)iVar5);
          PacketBuilder::AddByte((PacketBuilder *)local_210,0xff);
          peVar13 = std::__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_168);
          PacketBuilder::AddBreakString((PacketBuilder *)local_210,&peVar13->tag,0xff);
          peVar13 = std::__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_168);
          PacketBuilder::AddBreakString((PacketBuilder *)local_210,&peVar13->name,0xff);
          PacketBuilder::AddBreakString((PacketBuilder *)local_210,(string *)&reply.add_size,0xff);
          num = Character::HasItem(character,1,false);
          PacketBuilder::AddInt((PacketBuilder *)local_210,num);
          Character::Send(character,(PacketBuilder *)local_210);
          std::__shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>::reset
                    (&(character->guild_create).
                      super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>);
          PacketBuilder::~PacketBuilder((PacketBuilder *)local_210);
          std::__cxx11::string::~string((string *)&reply.add_size);
          std::shared_ptr<Guild>::~shared_ptr((shared_ptr<Guild> *)local_168);
        }
        std::shared_ptr<Guild_Create>::~shared_ptr((shared_ptr<Guild_Create> *)local_110);
      }
    }
    local_d8 = 0;
  }
  else {
    local_d8 = 1;
  }
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string
            ((string *)
             &name.super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
              super__Hash_node_code_cache<true>);
  return;
}

Assistant:

void Guild_Create(Character *character, PacketReader &reader)
{
	/*int session = */reader.GetInt();
	reader.GetByte();
	std::string tag = reader.GetBreakString();
	std::string name = reader.GetBreakString();
	std::string description = reader.GetBreakString();

	if (tag.length() > 3
	 || name.length() > std::size_t(int(character->world->config["GuildMaxNameLength"]))
	 || !character->world->guildmanager->ValidDescription(description))
	{
		return;
	}

	if (character->npc_type == ENF::Guild)
	{
		if (!character->guild
		 && character->HasItem(1) >= static_cast<int>(character->world->config["GuildPrice"]))
		{
			std::shared_ptr<class Guild_Create> create = character->world->guildmanager->GetCreate(tag);

			if (create && create->leader == character
			 && create->members.size() >= static_cast<std::size_t>(static_cast<int>(character->world->config["GuildCreateMembers"])))
			{
				std::shared_ptr<Guild> guild = character->world->guildmanager->CreateGuild(create, description);

				character->DelItem(1, character->world->config["GuildPrice"]);

				std::string rank_str = character->GuildRankString();

				PacketBuilder reply(PACKET_GUILD, PACKET_CREATE, 13 + guild->name.length() + rank_str.length());
				reply.AddShort(create->leader->PlayerID());
				reply.AddByte(255);
				reply.AddBreakString(guild->tag);
				reply.AddBreakString(guild->name);
				reply.AddBreakString(rank_str);
				reply.AddInt(character->HasItem(1));
				character->Send(reply);

				character->guild_create.reset();
			}
		}
	}
}